

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-unwrap.cpp
# Opt level: O1

void usage(FILE *stream)

{
  fprintf((FILE *)stream,
          "USAGE: %s [-h|-help] [-V]\n\n       %s [-1|-2] [-b <buffer-size>] [-d <duration>]\n       [-f <starting-frame>] [-m] [-p <frame-rate>] [-R] [-s <size>] [-v] [-W]\n       [-w] <input-file> [<file-prefix>]\n\n"
          ,"as-02-unwrap");
  fwrite("Options:\n  -1                - Split Wave essence to mono WAV files during extract.\n                      Default is multichannel WAV\n  -2                - Split Wave essence to stereo WAV files during extract.\n                      Default is multichannel WAV\n  -b <buffer-size>  - Specify size in bytes of picture frame buffer\n                      Defaults to 4,194,304 (4MB)\n  -d <duration>     - Number of frames to process, default all\n  -f <start-frame>  - Starting frame number, default 0\n  -g <SID>          - Extract the Generic Stream Partition payload\n  -h | -help        - Show help\n  -k <key-string>   - Use key for ciphertext operations\n  -m                - verify HMAC values when reading\n  -s <size>         - Number of bytes to dump to output when -v is given\n  -V                - Show version information\n  -v                - Verbose, prints informative messages to stderr\n  -W                - Read input file only, do not write destination file\n  -w <width>        - Width of numeric element in a series of frame file names\n                      (default 6)\n  -z                - Fail if j2c inputs have unequal parameters (default)\n  -Z                - Ignore unequal parameters in j2c inputs\n\n  NOTES: o There is no option grouping, all options must be distinct arguments.\n         o All option arguments must be separated from the option by whitespace.\n\n"
         ,0x566,1,(FILE *)stream);
  return;
}

Assistant:

void
usage(FILE* stream = stdout)
{
  fprintf(stream, "\
USAGE: %s [-h|-help] [-V]\n\
\n\
       %s [-1|-2] [-b <buffer-size>] [-d <duration>]\n\
       [-f <starting-frame>] [-m] [-p <frame-rate>] [-R] [-s <size>] [-v] [-W]\n\
       [-w] <input-file> [<file-prefix>]\n\n",
	  PROGRAM_NAME, PROGRAM_NAME);

  fprintf(stream, "\
Options:\n\
  -1                - Split Wave essence to mono WAV files during extract.\n\
                      Default is multichannel WAV\n\
  -2                - Split Wave essence to stereo WAV files during extract.\n\
                      Default is multichannel WAV\n\
  -b <buffer-size>  - Specify size in bytes of picture frame buffer\n\
                      Defaults to 4,194,304 (4MB)\n\
  -d <duration>     - Number of frames to process, default all\n\
  -f <start-frame>  - Starting frame number, default 0\n\
  -g <SID>          - Extract the Generic Stream Partition payload\n\
  -h | -help        - Show help\n\
  -k <key-string>   - Use key for ciphertext operations\n\
  -m                - verify HMAC values when reading\n\
  -s <size>         - Number of bytes to dump to output when -v is given\n\
  -V                - Show version information\n\
  -v                - Verbose, prints informative messages to stderr\n\
  -W                - Read input file only, do not write destination file\n\
  -w <width>        - Width of numeric element in a series of frame file names\n\
                      (default 6)\n\
  -z                - Fail if j2c inputs have unequal parameters (default)\n\
  -Z                - Ignore unequal parameters in j2c inputs\n\
\n\
  NOTES: o There is no option grouping, all options must be distinct arguments.\n\
         o All option arguments must be separated from the option by whitespace.\n\n");
}